

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGC.cpp
# Opt level: O1

void __thiscall
Test_testGarbageCollectionCorrectness17::Run(Test_testGarbageCollectionCorrectness17 *this)

{
  bool bVar1;
  int t;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((&Tests::testExecutor)[lVar2] == '\x01') {
      testsCount[lVar2] = testsCount[lVar2] + 1;
      bVar1 = Tests::RunCode(testGarbageCollectionCorrectness17,testTarget[lVar2],"5678",
                             "Garbage collection correctness 17 (unsized array target base is marked and checked as a whole)"
                             ,false);
      if (bVar1) {
        testsPassed[lVar2] = testsPassed[lVar2] + 1;
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

const char	*testGarbageCollectionCorrectness18 =
"import std.gc;\r\n\
class Data extendable\r\n\
{\r\n\
	int get(){ return boring; }\r\n\
	int boring;\r\n\
}\r\n\
class HiddenData : Data\r\n\
{\r\n\
	void HiddenData(int x){ value = new int(x); }\r\n\
	int get(){ return *value; }